

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O1

int lj_trace_exit(jit_State *J,void *exptr)

{
  char cVar1;
  lua_State *L;
  TValue *pTVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ptrdiff_t argbase;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  BCIns *pBVar10;
  byte bVar11;
  ulong uVar12;
  ExitDataCP exd;
  jit_State *local_48;
  void *local_40;
  BCIns *local_38;
  
  piVar6 = __errno_location();
  iVar5 = *piVar6;
  L = J->L;
  local_48 = J;
  local_40 = exptr;
  iVar4 = lj_vm_cpcall(L,0,&local_48,trace_exit_cp);
  if (iVar4 != 0) {
    return -iVar4;
  }
  if (((*(byte *)((ulong)(L->glref).ptr32 + 0x93) & 8) != 0) &&
     (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_TEXIT), argbase != 0)) {
    if ((long)((ulong)(L->maxstack).ptr32 - (long)L->top) < 0x1c1) {
      lj_state_growstack(L,0x38);
    }
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->n = (double)(int)J->parent;
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->n = (double)(int)J->exitno;
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->u64 = 0x4030000000000000;
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->u64 = 0x4030000000000000;
    lVar7 = 0;
    do {
      lVar3 = *(long *)((long)exptr + lVar7 * 8 + 0x80);
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pTVar2->n = (double)lVar3;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    lVar7 = 0;
    do {
      *L->top = *(TValue *)((long)exptr + lVar7 * 8);
      if (NAN(L->top->n)) {
        L->top->u64 = 0xfff8000000000000;
      }
      L->top = L->top + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    lj_vmevent_call(L,argbase);
  }
  uVar12 = (ulong)L->cframe & 0xfffffffffffffffc;
  *(int *)(uVar12 + 0x1c) = (int)local_38;
  uVar8 = (ulong)(L->glref).ptr32;
  cVar1 = *(char *)(uVar8 + 0x29);
  if ((cVar1 == '\x05') || (cVar1 == '\x02')) {
    if ((*(byte *)(uVar8 + 0x91) & 0x40) == 0) {
      lj_gc_step(L);
    }
  }
  else if ((J[-1].penalty[0x3d].pc.ptr32 & 0x6000) == 0) {
    lVar7 = *(long *)((ulong)J->trace[J->parent].gcptr32 + 0x20);
    cVar1 = *(char *)(lVar7 + 7 + (ulong)J->exitno * 8);
    if ((cVar1 != -1) &&
       (bVar11 = cVar1 + 1, *(byte *)(lVar7 + 7 + (ulong)J->exitno * 8) = bVar11,
       J->param[6] <= (int)(uint)bVar11)) {
      J->state = LJ_TRACE_START;
      lj_trace_ins(J,local_38);
    }
  }
  uVar9 = *local_38;
  pBVar10 = local_38;
  if (((char)uVar9 == 'S') &&
     (uVar8 = (ulong)J->trace[uVar9 >> 0x10].gcptr32, 0xfffffffb < *(byte *)(uVar8 + 0x38) - 0x49))
  {
    pBVar10 = (BCIns *)(uVar8 + 0x38);
    if (J->state == LJ_TRACE_RECORD) {
      J->patchins = uVar9;
      J->patchpc = local_38;
      *local_38 = *pBVar10;
      J->bcskip = '\x01';
      pBVar10 = local_38;
    }
    else {
      *(int *)(uVar12 + 0x1c) = (int)pBVar10;
    }
  }
  *piVar6 = iVar5;
  uVar9 = *pBVar10;
  switch(uVar9 & 0xff) {
  case 0x3c:
    iVar5 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
    uVar9 = uVar9 >> 8 & 0xff;
    break;
  case 0x3d:
  case 0x3f:
    return (int)((ulong)((long)L->top - (long)L->base) >> 3) -
           ((uVar9 >> 0x10 & 0xff) + (uVar9 >> 8 & 0xff));
  default:
    if ((uVar9 & 0xff) < 0x55) {
      return 0;
    }
    iVar5 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
    goto LAB_00111b13;
  case 0x45:
    iVar5 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
    uVar9 = (uVar9 >> 0x10) + (uVar9 >> 8 & 0xff);
  }
  iVar5 = iVar5 - uVar9;
LAB_00111b13:
  return iVar5 + 1;
}

Assistant:

int LJ_FASTCALL lj_trace_exit(jit_State *J, void *exptr)
{
  ERRNO_SAVE
  lua_State *L = J->L;
  ExitState *ex = (ExitState *)exptr;
  ExitDataCP exd;
  int errcode;
  const BCIns *pc;
  void *cf;
  GCtrace *T;
#ifdef EXITSTATE_PCREG
  J->parent = trace_exit_find(J, (MCode *)(intptr_t)ex->gpr[EXITSTATE_PCREG]);
#endif
  T = traceref(J, J->parent); UNUSED(T);
#ifdef EXITSTATE_CHECKEXIT
  if (J->exitno == T->nsnap) {  /* Treat stack check like a parent exit. */
    lua_assert(T->root != 0);
    J->exitno = T->ir[REF_BASE].op2;
    J->parent = T->ir[REF_BASE].op1;
    T = traceref(J, J->parent);
  }
#endif
  lua_assert(T != NULL && J->exitno < T->nsnap);
  exd.J = J;
  exd.exptr = exptr;
  errcode = lj_vm_cpcall(L, NULL, &exd, trace_exit_cp);
  if (errcode)
    return -errcode;  /* Return negated error code. */

  lj_vmevent_send(L, TEXIT,
    lj_state_checkstack(L, 4+RID_NUM_GPR+RID_NUM_FPR+LUA_MINSTACK);
    setintV(L->top++, J->parent);
    setintV(L->top++, J->exitno);
    trace_exit_regs(L, ex);
  );

  pc = exd.pc;
  cf = cframe_raw(L->cframe);
  setcframe_pc(cf, pc);
  if (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize) {
    if (!(G(L)->hookmask & HOOK_GC))
      lj_gc_step(L);  /* Exited because of GC: drive GC forward. */
  } else {
    trace_hotside(J, pc);
  }
  if (bc_op(*pc) == BC_JLOOP) {
    BCIns *retpc = &traceref(J, bc_d(*pc))->startins;
    if (bc_isret(bc_op(*retpc))) {
      if (J->state == LJ_TRACE_RECORD) {
	J->patchins = *pc;
	J->patchpc = (BCIns *)pc;
	*J->patchpc = *retpc;
	J->bcskip = 1;
      } else {
	pc = retpc;
	setcframe_pc(cf, pc);
      }
    }
  }
  /* Return MULTRES or 0. */
  ERRNO_RESTORE
  switch (bc_op(*pc)) {
  case BC_CALLM: case BC_CALLMT:
    return (int)((BCReg)(L->top - L->base) - bc_a(*pc) - bc_c(*pc));
  case BC_RETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc) - bc_d(*pc));
  case BC_TSETM:
    return (int)((BCReg)(L->top - L->base) + 1 - bc_a(*pc));
  default:
    if (bc_op(*pc) >= BC_FUNCF)
      return (int)((BCReg)(L->top - L->base) + 1);
    return 0;
  }
}